

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O2

ngx_int_t ngx_output_chain(ngx_output_chain_ctx_t *ctx,ngx_chain_t *in)

{
  ngx_chain_t **ppnVar1;
  ushort uVar2;
  ngx_log_t *pnVar3;
  ngx_file_t *pnVar4;
  ngx_pool_t *pnVar5;
  ngx_chain_t *pnVar6;
  ngx_buf_t *pnVar7;
  ngx_int_t nVar8;
  ngx_buf_t *pnVar9;
  u_char *puVar10;
  ngx_chain_t **ppnVar11;
  undefined1 *puVar12;
  ngx_output_chain_filter_pt UNRECOVERED_JUMPTABLE;
  ushort uVar13;
  ushort uVar14;
  long lVar15;
  ngx_output_chain_ctx_t *pnVar16;
  size_t sVar17;
  size_t sVar18;
  ngx_buf_t *pnVar19;
  ulong uVar20;
  ngx_chain_t *pnVar21;
  ngx_buf_t *pnVar22;
  void *pvVar23;
  int iVar24;
  ngx_chain_t **ppnVar25;
  ulong size;
  ulong uVar26;
  size_t size_00;
  bool bVar27;
  byte bVar28;
  ngx_chain_t *local_50;
  ngx_chain_t *out;
  ngx_pool_t *local_40;
  undefined1 *local_38;
  
  bVar28 = 0;
  ppnVar1 = &ctx->in;
  if ((ctx->in == (ngx_chain_t *)0x0) && (ctx->busy == (ngx_chain_t *)0x0)) {
    if (in == (ngx_chain_t *)0x0) {
      UNRECOVERED_JUMPTABLE = ctx->output_filter;
      pvVar23 = ctx->filter_ctx;
      in = (ngx_chain_t *)0x0;
LAB_00115f37:
      nVar8 = (*UNRECOVERED_JUMPTABLE)(pvVar23,in);
      return nVar8;
    }
    if ((in->next == (ngx_chain_t *)0x0) &&
       (((pnVar9 = in->buf, (pnVar9->field_0x48 & 0x10) == 0 || (pnVar9->file_last < 0x80000001)) &&
        (nVar8 = ngx_output_chain_as_is(ctx,pnVar9), nVar8 != 0)))) {
      UNRECOVERED_JUMPTABLE = ctx->output_filter;
      pvVar23 = ctx->filter_ctx;
      goto LAB_00115f37;
    }
  }
  else if (in == (ngx_chain_t *)0x0) goto LAB_001159fe;
  local_40 = ctx->pool;
  ppnVar11 = ppnVar1;
  do {
    ppnVar25 = ppnVar11;
    ppnVar11 = &(*ppnVar25)->next;
  } while (*ppnVar25 != (ngx_chain_t *)0x0);
  while (in != (ngx_chain_t *)0x0) {
    pnVar6 = ngx_alloc_chain_link(local_40);
    if (pnVar6 == (ngx_chain_t *)0x0) {
      return -1;
    }
    pnVar9 = in->buf;
    if ((((pnVar9->field_0x48 & 0x10) == 0) || (0x7fffffff < pnVar9->file_pos)) ||
       (pnVar9->file_last < 0x80000001)) {
      pnVar6->buf = pnVar9;
      in = in->next;
    }
    else {
      pnVar7 = (ngx_buf_t *)ngx_pcalloc(local_40,0x50);
      if (pnVar7 == (ngx_buf_t *)0x0) {
        return -1;
      }
      pnVar19 = pnVar9;
      pnVar22 = pnVar7;
      for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
        pnVar22->pos = pnVar19->pos;
        pnVar19 = (ngx_buf_t *)((long)pnVar19 + ((ulong)bVar28 * -2 + 1) * 8);
        pnVar22 = (ngx_buf_t *)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      if ((pnVar9->field_0x48 & 7) != 0) {
        puVar10 = pnVar9->pos;
        pnVar9->pos = puVar10 + (0x80000000 - pnVar9->file_pos);
        pnVar7->last = puVar10 + (0x80000000 - pnVar9->file_pos);
      }
      pnVar9->file_pos = 0x80000000;
      pnVar7->file_last = 0x80000000;
      pnVar6->buf = pnVar7;
    }
    pnVar6->next = (ngx_chain_t *)0x0;
    *ppnVar25 = pnVar6;
    ppnVar25 = &pnVar6->next;
  }
LAB_001159fe:
  local_50 = (ngx_chain_t *)0x0;
  puVar12 = &DAT_00000001;
  do {
    local_40 = (ngx_pool_t *)&local_50;
LAB_00115a1e:
    pnVar6 = *ppnVar1;
    while( true ) {
      pnVar21 = local_50;
      if (pnVar6 == (ngx_chain_t *)0x0) goto LAB_00115e82;
      pnVar9 = pnVar6->buf;
      uVar2 = *(ushort *)&pnVar9->field_0x48;
      if ((uVar2 & 7) == 0) {
        size = pnVar9->file_last - pnVar9->file_pos;
      }
      else {
        size = (long)pnVar9->last - (long)pnVar9->pos;
      }
      if ((size != 0) || ((uVar2 & 0xe0) != 0 && (uVar2 & 0x17) == 0)) break;
      pnVar3 = ctx->pool->log;
      if (1 < pnVar3->log_level) {
        ngx_log_error_core(2,pnVar3,0,"zero size buf in output t:%d r:%d f:%d %p %p-%p %p %O-%O",
                           (ulong)(uVar2 & 1),(ulong)(uVar2 >> 3 & 1),(ulong)(uVar2 >> 4 & 1),
                           pnVar9->start,pnVar9->pos,pnVar9->last,pnVar9->file,pnVar9->file_pos,
                           pnVar9->file_last);
      }
      ngx_debug_point();
      pnVar6 = (*ppnVar1)->next;
      *ppnVar1 = pnVar6;
    }
    nVar8 = ngx_output_chain_as_is(ctx,pnVar9);
    if (nVar8 != 0) {
      pnVar6 = *ppnVar1;
      ppnVar11 = &pnVar6->next;
      *ppnVar1 = pnVar6->next;
      pnVar16 = (ngx_output_chain_ctx_t *)ppnVar11;
      goto LAB_00115e6a;
    }
    pnVar9 = ctx->buf;
    if (pnVar9 != (ngx_buf_t *)0x0) {
LAB_00115c80:
      pnVar7 = (*ppnVar1)->buf;
      uVar2 = *(ushort *)&pnVar7->field_0x48;
      if ((uVar2 & 7) == 0) {
        sVar18 = pnVar7->file_last - pnVar7->file_pos;
      }
      else {
        sVar18 = (long)pnVar7->last - (long)pnVar7->pos;
      }
      puVar10 = pnVar9->pos;
      size_00 = (long)pnVar9->end - (long)puVar10;
      if ((long)sVar18 < (long)size_00) {
        size_00 = sVar18;
      }
      bVar27 = (ctx->field_0x20 & 3) == 1;
      if (((uVar2 & 0x10) != 0) && (0x7fffffff < pnVar7->file_pos)) {
        bVar27 = false;
      }
      out = (ngx_chain_t *)pnVar9;
      local_38 = puVar12;
      if ((uVar2 & 7) == 0) {
        sVar18 = ngx_read_file(pnVar7->file,puVar10,size_00,pnVar7->file_pos);
        if (sVar18 == 0xffffffffffffffff) {
          return -1;
        }
        if (sVar18 != size_00) {
          pnVar3 = ctx->pool->log;
          if (pnVar3->log_level < 2) {
            return -1;
          }
          ngx_log_error_core(2,pnVar3,0,"pread() read only %z of %O from \"%s\"",sVar18,size_00,
                             (pnVar7->file->name).data);
          return -1;
        }
        out->next = (ngx_chain_t *)((long)&out->next->buf + size_00);
        ppnVar11 = &out[4].next;
        if (bVar27) {
          *(ushort *)&out[4].next = *(ushort *)&out[4].next | 0x10;
          out[3].next = (ngx_chain_t *)pnVar7->file;
          pnVar9 = (ngx_buf_t *)pnVar7->file_pos;
          out[1].buf = pnVar9;
          pnVar6 = (ngx_chain_t *)((long)&pnVar9->pos + size_00);
          out[1].next = pnVar6;
        }
        else {
          *(ushort *)ppnVar11 = *(ushort *)&out[4].next & 0xffef;
          pnVar6 = (ngx_chain_t *)(size_00 + pnVar7->file_pos);
        }
        pnVar7->file_pos = (off_t)pnVar6;
        if (pnVar6 == (ngx_chain_t *)pnVar7->file_last) goto LAB_00115ddc;
      }
      else {
        memcpy(puVar10,pnVar7->pos,size_00);
        pnVar7->pos = pnVar7->pos + size_00;
        out->next = (ngx_chain_t *)((long)&out->next->buf + size_00);
        if ((pnVar7->field_0x48 & 0x10) == 0) {
          *(byte *)&out[4].next = *(byte *)&out[4].next & 0xef;
        }
        else {
          if (bVar27) {
            *(ushort *)&out[4].next = *(ushort *)&out[4].next | 0x10;
            out[3].next = (ngx_chain_t *)pnVar7->file;
            pnVar9 = (ngx_buf_t *)pnVar7->file_pos;
            out[1].buf = pnVar9;
            pnVar6 = (ngx_chain_t *)((long)&pnVar9->pos + size_00);
            out[1].next = pnVar6;
          }
          else {
            *(ushort *)&out[4].next = *(ushort *)&out[4].next & 0xffef;
            pnVar6 = (ngx_chain_t *)(size_00 + pnVar7->file_pos);
          }
          pnVar7->file_pos = (off_t)pnVar6;
        }
        if (pnVar7->pos == pnVar7->last) {
          ppnVar11 = &out[4].next;
LAB_00115ddc:
          uVar13 = *(ushort *)&pnVar7->field_0x48 & 0x20;
          uVar2 = (ushort)*(undefined4 *)ppnVar11;
          *(ushort *)ppnVar11 = uVar2 & 0xffdf | uVar13;
          uVar14 = *(ushort *)&pnVar7->field_0x48 & 0x80;
          *(ushort *)ppnVar11 = uVar2 & 0xff5f | uVar13 | uVar14;
          *(ushort *)ppnVar11 =
               uVar2 & 0xfe5f | uVar13 | uVar14 | *(ushort *)&pnVar7->field_0x48 & 0x100;
        }
      }
      puVar12 = local_38;
      pnVar9 = (*ppnVar1)->buf;
      if ((pnVar9->field_0x48 & 7) == 0) {
        lVar15 = pnVar9->file_last - pnVar9->file_pos;
      }
      else {
        lVar15 = (long)pnVar9->last - (long)pnVar9->pos;
      }
      if (lVar15 == 0) {
        *ppnVar1 = (*ppnVar1)->next;
      }
      pnVar6 = ngx_alloc_chain_link(ctx->pool);
      if (pnVar6 == (ngx_chain_t *)0x0) {
        return -1;
      }
      pnVar6->buf = ctx->buf;
      ppnVar11 = &pnVar6->next;
      pnVar6->next = (ngx_chain_t *)0x0;
      pnVar16 = ctx;
LAB_00115e6a:
      *(ngx_chain_t **)local_40 = pnVar6;
      pnVar16->buf = (ngx_buf_t *)0x0;
      local_40 = (ngx_pool_t *)ppnVar11;
      goto LAB_00115a1e;
    }
    pnVar9 = (*ppnVar1)->buf;
    pnVar4 = pnVar9->file;
    if ((pnVar4 != (ngx_file_t *)0x0) && ((pnVar4->field_0xc0 & 2) != 0)) {
      ctx->field_0x20 = ctx->field_0x20 | 2;
      uVar20 = ctx->alignment - 1U & pnVar9->file_pos;
      if (uVar20 == 0) {
        if ((long)(ctx->bufs).size <= (long)size) goto LAB_00115b1f;
      }
      else {
        sVar17 = ctx->alignment - uVar20;
        if ((long)sVar17 < (long)size) {
          size = sVar17;
        }
      }
      pnVar9 = ngx_create_temp_buf(ctx->pool,size);
      ctx->buf = pnVar9;
      if (pnVar9 == (ngx_buf_t *)0x0) {
        return -1;
      }
      goto LAB_00115c80;
    }
LAB_00115b1f:
    pnVar21 = ctx->free;
    if (pnVar21 != (ngx_chain_t *)0x0) {
      pnVar9 = pnVar21->buf;
      ctx->buf = pnVar9;
      ctx->free = pnVar21->next;
      pnVar5 = ctx->pool;
      pnVar21->next = pnVar5->chain;
      pnVar5->chain = pnVar21;
      goto LAB_00115c80;
    }
    pnVar21 = local_50;
    if (local_50 != (ngx_chain_t *)0x0) goto LAB_00115e93;
    lVar15 = (ctx->bufs).num;
    if (ctx->allocated != lVar15) {
      uVar20 = (ctx->bufs).size;
      iVar24 = (int)CONCAT62((int6)((ulong)pnVar6 >> 0x10),8);
      if (((*ppnVar1)->buf->field_0x49 & 1) != 0) {
        if ((long)size < (long)uVar20) {
          iVar24 = 0;
          uVar20 = size;
        }
        else if ((lVar15 == 1) && ((ctx->field_0x20 & 2) == 0)) {
          lVar15 = (uVar20 >> 2) + uVar20;
          uVar26 = size;
          if (lVar15 <= (long)size) {
            uVar26 = uVar20;
          }
          iVar24 = (uint)(lVar15 <= (long)size) << 3;
          uVar20 = uVar26;
        }
      }
      pnVar9 = (ngx_buf_t *)ngx_pcalloc(ctx->pool,0x50);
      if (pnVar9 == (ngx_buf_t *)0x0) {
        return -1;
      }
      out = (ngx_chain_t *)CONCAT44(out._4_4_,iVar24);
      if ((ctx->field_0x20 & 2) == 0) {
        puVar10 = (u_char *)ngx_palloc(ctx->pool,uVar20);
      }
      else {
        puVar10 = (u_char *)ngx_pmemalign(ctx->pool,uVar20,ctx->alignment);
      }
      pnVar9->start = puVar10;
      if (puVar10 == (u_char *)0x0) {
        return -1;
      }
      pnVar9->pos = puVar10;
      pnVar9->last = puVar10;
      pnVar9->end = puVar10 + uVar20;
      uVar2 = (ushort)*(undefined4 *)&pnVar9->field_0x48;
      *(ushort *)&pnVar9->field_0x48 = uVar2 | 1;
      pnVar9->tag = ctx->tag;
      *(ushort *)&pnVar9->field_0x48 = (ushort)out | uVar2 & 0xfff7 | 1;
      ctx->buf = pnVar9;
      ctx->allocated = ctx->allocated + 1;
      goto LAB_00115c80;
    }
    pnVar21 = (ngx_chain_t *)0x0;
LAB_00115e82:
    if (puVar12 != &DAT_00000001 && pnVar21 == (ngx_chain_t *)0x0) {
      if (pnVar6 != (ngx_chain_t *)0x0) {
        return -2;
      }
      return (ngx_int_t)puVar12;
    }
LAB_00115e93:
    puVar12 = (undefined1 *)(*ctx->output_filter)(ctx->filter_ctx,pnVar21);
    if (puVar12 == (undefined1 *)0xfffffffffffffffc) {
      return -4;
    }
    if (puVar12 == (undefined1 *)0xffffffffffffffff) {
      return -1;
    }
    ngx_chain_update_chains(ctx->pool,&ctx->free,&ctx->busy,&local_50,ctx->tag);
  } while( true );
}

Assistant:

ngx_int_t
ngx_output_chain(ngx_output_chain_ctx_t *ctx, ngx_chain_t *in)
{
    off_t         bsize;
    ngx_int_t     rc, last;
    ngx_chain_t  *cl, *out, **last_out;

    if (ctx->in == NULL && ctx->busy == NULL
#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        && !ctx->aio
#endif
       )
    {
        /*
         * the short path for the case when the ctx->in and ctx->busy chains
         * are empty, the incoming chain is empty too or has the single buf
         * that does not require the copy
         */

        if (in == NULL) {
            return ctx->output_filter(ctx->filter_ctx, in);
        }

        if (in->next == NULL
#if (NGX_SENDFILE_LIMIT)
            && !(in->buf->in_file && in->buf->file_last > NGX_SENDFILE_LIMIT)
#endif
            && ngx_output_chain_as_is(ctx, in->buf))
        {
            return ctx->output_filter(ctx->filter_ctx, in);
        }
    }

    /* add the incoming buf to the chain ctx->in */

    if (in) {
        if (ngx_output_chain_add_copy(ctx->pool, &ctx->in, in) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    out = NULL;
    last_out = &out;
    last = NGX_NONE;

    for ( ;; ) {

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        if (ctx->aio) {
            return NGX_AGAIN;
        }
#endif

        while (ctx->in) {

            /*
             * cycle while there are the ctx->in bufs
             * and there are the free output bufs to copy in
             */

            bsize = ngx_buf_size(ctx->in->buf);

            if (bsize == 0 && !ngx_buf_special(ctx->in->buf)) {

                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                              "zero size buf in output "
                              "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                              ctx->in->buf->temporary,
                              ctx->in->buf->recycled,
                              ctx->in->buf->in_file,
                              ctx->in->buf->start,
                              ctx->in->buf->pos,
                              ctx->in->buf->last,
                              ctx->in->buf->file,
                              ctx->in->buf->file_pos,
                              ctx->in->buf->file_last);

                ngx_debug_point();

                ctx->in = ctx->in->next;

                continue;
            }

            if (ngx_output_chain_as_is(ctx, ctx->in->buf)) {

                /* move the chain link to the output chain */

                cl = ctx->in;
                ctx->in = cl->next;

                *last_out = cl;
                last_out = &cl->next;
                cl->next = NULL;

                continue;
            }

            if (ctx->buf == NULL) {

                rc = ngx_output_chain_align_file_buf(ctx, bsize);

                if (rc == NGX_ERROR) {
                    return NGX_ERROR;
                }

                if (rc != NGX_OK) {

                    if (ctx->free) {

                        /* get the free buf */

                        cl = ctx->free;
                        ctx->buf = cl->buf;
                        ctx->free = cl->next;

                        ngx_free_chain(ctx->pool, cl);

                    } else if (out || ctx->allocated == ctx->bufs.num) {

                        break;

                    } else if (ngx_output_chain_get_buf(ctx, bsize) != NGX_OK) {
                        return NGX_ERROR;
                    }
                }
            }

            rc = ngx_output_chain_copy_buf(ctx);

            if (rc == NGX_ERROR) {
                return rc;
            }

            if (rc == NGX_AGAIN) {
                if (out) {
                    break;
                }

                return rc;
            }

            /* delete the completed buf from the ctx->in chain */

            if (ngx_buf_size(ctx->in->buf) == 0) {
                ctx->in = ctx->in->next;
            }

            cl = ngx_alloc_chain_link(ctx->pool);
            if (cl == NULL) {
                return NGX_ERROR;
            }

            cl->buf = ctx->buf;
            cl->next = NULL;
            *last_out = cl;
            last_out = &cl->next;
            ctx->buf = NULL;
        }

        if (out == NULL && last != NGX_NONE) {

            if (ctx->in) {
                return NGX_AGAIN;
            }

            return last;
        }

        last = ctx->output_filter(ctx->filter_ctx, out);

        if (last == NGX_ERROR || last == NGX_DONE) {
            return last;
        }

        ngx_chain_update_chains(ctx->pool, &ctx->free, &ctx->busy, &out,
                                ctx->tag);
        last_out = &out;
    }
}